

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen_status yajl_gen_string(yajl_gen g,uchar *str,size_t len)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  size_t in_RDX;
  uchar *in_RSI;
  uint *in_RDI;
  yajl_print_t unaff_retaddr;
  uint _i;
  uint local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  yajl_gen_status yVar6;
  
  if (((*in_RDI & 8) == 0) || (iVar4 = yajl_string_validate_utf8(in_RSI,in_RDX), iVar4 != 0)) {
    if (in_RDI[(ulong)in_RDI[1] + 4] == 7) {
      yVar6 = yajl_gen_in_error_state;
    }
    else if (in_RDI[(ulong)in_RDI[1] + 4] == 6) {
      yVar6 = yajl_gen_generation_complete;
    }
    else {
      if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 5)) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),",",1);
        if ((*in_RDI & 1) != 0) {
          (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
        }
      }
      else if ((in_RDI[(ulong)in_RDI[1] + 4] == 3) &&
              ((**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),":",1),
              (*in_RDI & 1) != 0)) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86)," ",1);
      }
      iVar4 = (int)(in_RDX >> 0x20);
      if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] != 3)) {
        for (local_24 = 0; iVar4 = (int)(in_RDX >> 0x20), local_24 < in_RDI[1];
            local_24 = local_24 + 1) {
          pcVar1 = *(code **)(in_RDI + 0x84);
          uVar2 = *(undefined8 *)(in_RDI + 0x86);
          uVar3 = *(undefined8 *)(in_RDI + 2);
          sVar5 = strlen(*(char **)(in_RDI + 2));
          (*pcVar1)(uVar2,uVar3,sVar5 & 0xffffffff);
        }
      }
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86));
      yajl_string_encode(unaff_retaddr,
                         (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (uchar *)in_RDI,(size_t)in_RSI,iVar4);
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\"",1);
      switch(in_RDI[(ulong)in_RDI[1] + 4]) {
      case 0:
        in_RDI[(ulong)in_RDI[1] + 4] = 6;
        break;
      case 1:
      case 2:
        in_RDI[(ulong)in_RDI[1] + 4] = 3;
        break;
      case 3:
        in_RDI[(ulong)in_RDI[1] + 4] = 2;
        break;
      case 4:
        in_RDI[(ulong)in_RDI[1] + 4] = 5;
      }
      if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] == 6)) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
      yVar6 = yajl_gen_status_ok;
    }
  }
  else {
    yVar6 = yajl_gen_invalid_string;
  }
  return yVar6;
}

Assistant:

yajl_gen_status
yajl_gen_string(yajl_gen g, const unsigned char * str,
                size_t len)
{
    // if validation is enabled, check that the string is valid utf8
    // XXX: This checking could be done a little faster, in the same pass as
    // the string encoding
    if (g->flags & yajl_gen_validate_utf8) {
        if (!yajl_string_validate_utf8(str, len)) {
            return yajl_gen_invalid_string;
        }
    }
    ENSURE_VALID_STATE; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "\"", 1);
    yajl_string_encode(g->print, g->ctx, str, len, g->flags & yajl_gen_escape_solidus);
    g->print(g->ctx, "\"", 1);
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}